

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validators_inl.hpp
# Opt level: O0

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* CLI::detail::split_program_name
            (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *__return_storage_ptr__,string *commandline)

{
  path_type pVar1;
  char *pcVar2;
  ulong uVar3;
  long lVar4;
  char cVar5;
  bool bVar6;
  string local_178 [32];
  string local_158 [39];
  allocator local_131;
  string local_130;
  allocator local_109;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  string local_c8;
  string local_a8;
  string local_88 [32];
  long local_68;
  size_type end;
  string local_58 [6];
  value_type keyChar;
  bool embeddedQuote;
  ulong local_38;
  size_type esp;
  undefined1 local_19;
  string *local_18;
  string *commandline_local;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vals;
  
  local_19 = 0;
  local_18 = commandline;
  commandline_local = &__return_storage_ptr__->first;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (__return_storage_ptr__);
  trim(commandline);
  cVar5 = (char)commandline;
  local_38 = ::std::__cxx11::string::find_first_of(cVar5,0x20);
  do {
    ::std::__cxx11::string::substr((ulong)local_58,(ulong)commandline);
    pcVar2 = (char *)::std::__cxx11::string::c_str();
    pVar1 = check_path(pcVar2);
    ::std::__cxx11::string::~string(local_58);
    if (pVar1 == file) goto LAB_0021747f;
    local_38 = ::std::__cxx11::string::find_first_of(cVar5,0x20);
  } while (local_38 != 0xffffffffffffffff);
  pcVar2 = (char *)::std::__cxx11::string::operator[]((ulong)commandline);
  if (((*pcVar2 == '\"') ||
      (pcVar2 = (char *)::std::__cxx11::string::operator[]((ulong)commandline), *pcVar2 == '\'')) ||
     (pcVar2 = (char *)::std::__cxx11::string::operator[]((ulong)commandline), *pcVar2 == '`')) {
    end._7_1_ = 0;
    pcVar2 = (char *)::std::__cxx11::string::operator[]((ulong)commandline);
    end._6_1_ = *pcVar2;
    local_68 = ::std::__cxx11::string::find_first_of(cVar5,(ulong)(uint)(int)end._6_1_);
    while( true ) {
      bVar6 = false;
      if (local_68 != -1) {
        pcVar2 = (char *)::std::__cxx11::string::operator[]((ulong)commandline);
        bVar6 = *pcVar2 == '\\';
      }
      if (!bVar6) break;
      local_68 = ::std::__cxx11::string::find_first_of(cVar5,(ulong)(uint)(int)end._6_1_);
      end._7_1_ = 1;
    }
    if (local_68 == -1) {
      local_38 = ::std::__cxx11::string::find_first_of(cVar5,0x20);
    }
    else {
      ::std::__cxx11::string::substr((ulong)local_88,(ulong)commandline);
      ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_88);
      ::std::__cxx11::string::~string(local_88);
      local_38 = local_68 + 1;
      if ((end._7_1_ & 1) != 0) {
        ::std::__cxx11::string::string((string *)&local_c8,(string *)__return_storage_ptr__);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_108,"\\",&local_109);
        ::std::operator+(&local_e8,&local_108,end._6_1_);
        cVar5 = end._6_1_;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_130,1,cVar5,&local_131);
        find_and_replace(&local_a8,&local_c8,&local_e8,&local_130);
        ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_a8);
        ::std::__cxx11::string::~string((string *)&local_a8);
        ::std::__cxx11::string::~string((string *)&local_130);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_131);
        ::std::__cxx11::string::~string((string *)&local_e8);
        ::std::__cxx11::string::~string((string *)&local_108);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_109);
        ::std::__cxx11::string::~string((string *)&local_c8);
      }
    }
  }
  else {
    local_38 = ::std::__cxx11::string::find_first_of(cVar5,0x20);
  }
LAB_0021747f:
  uVar3 = ::std::__cxx11::string::empty();
  if ((uVar3 & 1) != 0) {
    ::std::__cxx11::string::substr((ulong)local_158,(ulong)commandline);
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_158);
    ::std::__cxx11::string::~string(local_158);
    rtrim(&__return_storage_ptr__->first);
  }
  uVar3 = local_38;
  lVar4 = ::std::__cxx11::string::length();
  if (uVar3 < lVar4 - 1U) {
    ::std::__cxx11::string::substr((ulong)local_178,(ulong)commandline);
  }
  else {
    ::std::__cxx11::string::string(local_178);
  }
  ::std::__cxx11::string::operator=((string *)&__return_storage_ptr__->second,local_178);
  ::std::__cxx11::string::~string(local_178);
  ltrim(&__return_storage_ptr__->second);
  return __return_storage_ptr__;
}

Assistant:

CLI11_INLINE std::pair<std::string, std::string> split_program_name(std::string commandline) {
    // try to determine the programName
    std::pair<std::string, std::string> vals;
    trim(commandline);
    auto esp = commandline.find_first_of(' ', 1);
    while(detail::check_path(commandline.substr(0, esp).c_str()) != path_type::file) {
        esp = commandline.find_first_of(' ', esp + 1);
        if(esp == std::string::npos) {
            // if we have reached the end and haven't found a valid file just assume the first argument is the
            // program name
            if(commandline[0] == '"' || commandline[0] == '\'' || commandline[0] == '`') {
                bool embeddedQuote = false;
                auto keyChar = commandline[0];
                auto end = commandline.find_first_of(keyChar, 1);
                while((end != std::string::npos) && (commandline[end - 1] == '\\')) {  // deal with escaped quotes
                    end = commandline.find_first_of(keyChar, end + 1);
                    embeddedQuote = true;
                }
                if(end != std::string::npos) {
                    vals.first = commandline.substr(1, end - 1);
                    esp = end + 1;
                    if(embeddedQuote) {
                        vals.first = find_and_replace(vals.first, std::string("\\") + keyChar, std::string(1, keyChar));
                    }
                } else {
                    esp = commandline.find_first_of(' ', 1);
                }
            } else {
                esp = commandline.find_first_of(' ', 1);
            }

            break;
        }
    }
    if(vals.first.empty()) {
        vals.first = commandline.substr(0, esp);
        rtrim(vals.first);
    }

    // strip the program name
    vals.second = (esp < commandline.length() - 1) ? commandline.substr(esp + 1) : std::string{};
    ltrim(vals.second);
    return vals;
}